

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O2

StreamWriter * __thiscall Json::StreamWriterBuilder::newStreamWriter(StreamWriterBuilder *this)

{
  bool bVar1;
  bool bVar2;
  bool useSpecialFloats;
  bool emitUTF8;
  bool bVar3;
  UInt UVar4;
  uint precision;
  Value *pVVar5;
  BuiltStyledStreamWriter *this_00;
  PrecisionType precisionType;
  Value *this_01;
  Enum local_174;
  String colonSymbol;
  String nullSymbol;
  String endingLineFeedSymbol;
  String pt_str;
  String cs_str;
  String indentation;
  String local_b0;
  String local_90;
  String local_70;
  String local_50;
  
  this_01 = &this->settings_;
  pVVar5 = Value::operator[](this_01,"indentation");
  Value::asString_abi_cxx11_(&indentation,pVVar5);
  pVVar5 = Value::operator[](this_01,"commentStyle");
  Value::asString_abi_cxx11_(&cs_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"precisionType");
  Value::asString_abi_cxx11_(&pt_str,pVVar5);
  pVVar5 = Value::operator[](this_01,"enableYAMLCompatibility");
  bVar1 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"dropNullPlaceholders");
  bVar2 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"useSpecialFloats");
  useSpecialFloats = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"emitUTF8");
  emitUTF8 = Value::asBool(pVVar5);
  pVVar5 = Value::operator[](this_01,"precision");
  UVar4 = Value::asUInt(pVVar5);
  bVar3 = std::operator==(&cs_str,"All");
  if (bVar3) {
    local_174 = All;
  }
  else {
    bVar3 = std::operator==(&cs_str,"None");
    local_174 = None;
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&colonSymbol,"commentStyle must be \'All\' or \'None\'",
                 (allocator<char> *)&nullSymbol);
      throwRuntimeError(&colonSymbol);
    }
  }
  bVar3 = std::operator==(&pt_str,"significant");
  precisionType = significantDigits;
  if (!bVar3) {
    bVar3 = std::operator==(&pt_str,"decimal");
    if (!bVar3) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&colonSymbol,"precisionType must be \'significant\' or \'decimal\'",
                 (allocator<char> *)&nullSymbol);
      throwRuntimeError(&colonSymbol);
    }
    precisionType = decimalPlaces;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&colonSymbol," : ",(allocator<char> *)&nullSymbol);
  if ((bVar1) || (indentation._M_string_length == 0)) {
    std::__cxx11::string::assign((char *)&colonSymbol);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nullSymbol,"null",(allocator<char> *)&endingLineFeedSymbol);
  if (bVar2) {
    nullSymbol._M_string_length = 0;
    *nullSymbol._M_dataplus._M_p = '\0';
  }
  endingLineFeedSymbol._M_dataplus._M_p = (pointer)&endingLineFeedSymbol.field_2;
  endingLineFeedSymbol._M_string_length = 0;
  endingLineFeedSymbol.field_2._M_local_buf[0] = '\0';
  this_00 = (BuiltStyledStreamWriter *)operator_new(0xe8);
  std::__cxx11::string::string((string *)&local_70,(string *)&indentation);
  std::__cxx11::string::string((string *)&local_90,(string *)&colonSymbol);
  std::__cxx11::string::string((string *)&local_b0,(string *)&nullSymbol);
  std::__cxx11::string::string((string *)&local_50,(string *)&endingLineFeedSymbol);
  precision = 0x11;
  if (UVar4 < 0x11) {
    precision = UVar4;
  }
  BuiltStyledStreamWriter::BuiltStyledStreamWriter
            (this_00,&local_70,local_174,&local_90,&local_b0,&local_50,useSpecialFloats,emitUTF8,
             precision,precisionType);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&endingLineFeedSymbol);
  std::__cxx11::string::~string((string *)&nullSymbol);
  std::__cxx11::string::~string((string *)&colonSymbol);
  std::__cxx11::string::~string((string *)&pt_str);
  std::__cxx11::string::~string((string *)&cs_str);
  std::__cxx11::string::~string((string *)&indentation);
  return &this_00->super_StreamWriter;
}

Assistant:

StreamWriter* StreamWriterBuilder::newStreamWriter() const {
  const String indentation = settings_["indentation"].asString();
  const String cs_str = settings_["commentStyle"].asString();
  const String pt_str = settings_["precisionType"].asString();
  const bool eyc = settings_["enableYAMLCompatibility"].asBool();
  const bool dnp = settings_["dropNullPlaceholders"].asBool();
  const bool usf = settings_["useSpecialFloats"].asBool();
  const bool emitUTF8 = settings_["emitUTF8"].asBool();
  unsigned int pre = settings_["precision"].asUInt();
  CommentStyle::Enum cs = CommentStyle::All;
  if (cs_str == "All") {
    cs = CommentStyle::All;
  } else if (cs_str == "None") {
    cs = CommentStyle::None;
  } else {
    throwRuntimeError("commentStyle must be 'All' or 'None'");
  }
  PrecisionType precisionType(significantDigits);
  if (pt_str == "significant") {
    precisionType = PrecisionType::significantDigits;
  } else if (pt_str == "decimal") {
    precisionType = PrecisionType::decimalPlaces;
  } else {
    throwRuntimeError("precisionType must be 'significant' or 'decimal'");
  }
  String colonSymbol = " : ";
  if (eyc) {
    colonSymbol = ": ";
  } else if (indentation.empty()) {
    colonSymbol = ":";
  }
  String nullSymbol = "null";
  if (dnp) {
    nullSymbol.clear();
  }
  if (pre > 17)
    pre = 17;
  String endingLineFeedSymbol;
  return new BuiltStyledStreamWriter(indentation, cs, colonSymbol, nullSymbol,
                                     endingLineFeedSymbol, usf, emitUTF8, pre,
                                     precisionType);
}